

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O3

vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> * __thiscall
fasttext::Meter::scoreVsTrue
          (vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
           *__return_storage_ptr__,Meter *this,int32_t labelId)

{
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *this_00;
  pointer ppVar1;
  pointer ppVar2;
  const_iterator cVar3;
  undefined8 uVar4;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *__range2;
  __node_base *p_Var5;
  int32_t local_1c;
  
  this_00 = &this->labelMetrics_;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c = labelId;
  if (labelId == -1) {
    p_Var5 = &(this->labelMetrics_)._M_h._M_before_begin;
    while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,(key_type *)(p_Var5 + 1));
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>.
          _M_cur == (__node_type *)0x0) {
        std::__throw_out_of_range("_Map_base::at");
        goto LAB_0013500e;
      }
      std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>>
                ((vector<std::pair<float,float>,std::allocator<std::pair<float,float>>> *)
                 __return_storage_ptr__,
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish,
                 *(undefined8 *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                         ._M_cur + 0x28),
                 *(undefined8 *)
                  ((long)cVar3.
                         super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                         ._M_cur + 0x30));
    }
  }
  else {
    cVar3 = std::
            _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_00->_M_h,&local_1c);
    if (cVar3.super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>.
        _M_cur != (__node_type *)0x0) {
      cVar3 = std::
              _Hashtable<int,_std::pair<const_int,_fasttext::Meter::Metrics>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&this_00->_M_h,&local_1c);
      if (cVar3.super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>.
          _M_cur == (__node_type *)0x0) {
LAB_0013500e:
        uVar4 = std::__throw_out_of_range("_Map_base::at");
        ppVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        if (ppVar1 != (pointer)0x0) {
          operator_delete(ppVar1,(long)(__return_storage_ptr__->
                                       super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ppVar1);
        }
        _Unwind_Resume(uVar4);
      }
      std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::operator=
                (__return_storage_ptr__,
                 (vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                 ((long)cVar3.
                        super__Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false>
                        ._M_cur + 0x28));
    }
  }
  ppVar1 = (__return_storage_ptr__->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (__return_storage_ptr__->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (ppVar1 != ppVar2) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2,(int)LZCOUNT((long)ppVar2 - (long)ppVar1 >> 3) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<float,float>*,std::vector<std::pair<float,float>,std::allocator<std::pair<float,float>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (ppVar1,ppVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<real, real>> Meter::scoreVsTrue(int32_t labelId) const {
  std::vector<std::pair<real, real>> ret;
  if (labelId == kAllLabels) {
    for (const auto& k : labelMetrics_) {
      auto& labelScoreVsTrue = labelMetrics_.at(k.first).scoreVsTrue;
      ret.insert(ret.end(), labelScoreVsTrue.begin(), labelScoreVsTrue.end());
    }
  } else {
    if (labelMetrics_.count(labelId)) {
      ret = labelMetrics_.at(labelId).scoreVsTrue;
    }
  }
  sort(ret.begin(), ret.end());

  return ret;
}